

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.cpp
# Opt level: O1

Namer * __thiscall
LiteScript::Namer::Load
          (Namer *__return_storage_ptr__,Namer *this,istream *stream,Memory *memory,
          offset_in_Memory_to_subr caller)

{
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Memory *pMVar5;
  Nullable<LiteScript::Variable> local_80;
  Namer *local_60;
  istream *local_58;
  Memory *local_50;
  Variable local_48;
  Namer *local_38;
  
  local_58 = stream + caller;
  pMVar5 = memory;
  if (((ulong)memory & 1) != 0) {
    pMVar5 = *(Memory **)((long)(memory->arr)._M_elems + *(long *)local_58 + -1);
  }
  local_50 = (Memory *)stream;
  uVar1 = (*(code *)pMVar5)(local_58,this);
  Memory::GetVariable(&local_80,local_50,uVar1);
  Variable::Variable(&local_48,(Variable *)&local_80);
  Namer(__return_storage_ptr__,&local_48);
  Variable::~Variable(&local_48);
  if (local_80.is_null == false) {
    Variable::~Variable((Variable *)&local_80);
  }
  pMVar5 = memory;
  if (((ulong)memory & 1) != 0) {
    pMVar5 = *(Memory **)((long)(memory->arr)._M_elems + *(long *)local_58 + -1);
  }
  local_60 = __return_storage_ptr__;
  uVar1 = (*(code *)pMVar5)(local_58,this);
  Memory::GetVariable(&local_80,local_50,uVar1);
  Nullable<LiteScript::Variable>::operator=(&__return_storage_ptr__->current,&local_80);
  if (local_80.is_null == false) {
    Variable::~Variable((Variable *)&local_80);
  }
  uVar1 = std::istream::get();
  uVar2 = std::istream::get();
  uVar3 = std::istream::get();
  iVar4 = std::istream::get();
  uVar1 = (uVar3 & 0xff) << 0x10 | iVar4 << 0x18 | (uVar2 & 0xff) << 8 | uVar1 & 0xff;
  if (uVar1 != 0) {
    this_00 = &local_60->heap;
    uVar2 = 0;
    local_38 = this;
    do {
      pMVar5 = memory;
      if (((ulong)memory & 1) != 0) {
        pMVar5 = *(Memory **)((long)(memory->arr)._M_elems + *(long *)local_58 + -1);
      }
      uVar3 = (*(code *)pMVar5)(local_58,local_38);
      Memory::GetVariable(&local_80,local_50,uVar3);
      Variable::Variable(&local_48,(Variable *)&local_80);
      std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
      emplace_back<LiteScript::Variable>(this_00,&local_48);
      Variable::~Variable(&local_48);
      if (local_80.is_null == false) {
        Variable::~Variable((Variable *)&local_80);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  return local_60;
}

Assistant:

LiteScript::Namer LiteScript::Namer::Load(std::istream &stream, Memory& memory, unsigned int (Memory::*caller)(std::istream&)) {
    Namer res(memory.GetVariable((memory.*caller)(stream)));
    res.current = memory.GetVariable((memory.*caller)(stream));
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    for (unsigned int i = 0; i < sz; i++)
        res.heap.push_back(memory.GetVariable((memory.*caller)(stream)));
    return res;
}